

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall
cmComputeLinkInformation::FinishLinkerSearchDirectories(cmComputeLinkInformation *this)

{
  cmake *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmState *pcVar4;
  ostream *poVar5;
  reference fullPath;
  PolicyID id;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_3d8;
  string local_3b8;
  undefined1 local_398 [8];
  ostringstream e;
  undefined1 local_220 [16];
  string local_210;
  ostringstream local_1f0 [8];
  ostringstream w;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmComputeLinkInformation *local_18;
  cmComputeLinkInformation *this_local;
  
  local_18 = this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->OldLinkDirItems);
  if (((bVar2) ||
      (bVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty(&this->OldUserFlagItems), bVar2)) || ((this->OldLinkDirMode & 1U) == 0)) {
    this_local._7_1_ = 1;
  }
  else {
    PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0003(this->Target);
    switch(PVar3) {
    case WARN:
      pcVar4 = cmake::GetState(this->CMakeInstance);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"CMP0003-WARNING-GIVEN",&local_39);
      bVar2 = cmState::GetGlobalPropertyAsBool(pcVar4,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pcVar4 = cmake::GetState(this->CMakeInstance);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"CMP0003-WARNING-GIVEN",&local_71);
        cmState::SetGlobalProperty(pcVar4,&local_70,"1");
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator(&local_71);
        std::__cxx11::ostringstream::ostringstream(local_1f0);
        PrintLinkPolicyDiagnosis(this,(ostream *)local_1f0);
        pcVar1 = this->CMakeInstance;
        std::__cxx11::ostringstream::str();
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_220);
        cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)(local_220 + 0x10),
                            (cmListFileBacktrace *)local_220);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_220);
        std::__cxx11::string::~string((string *)(local_220 + 0x10));
        std::__cxx11::ostringstream::~ostringstream(local_1f0);
      }
    case OLD:
    default:
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->OldLinkDirItems);
      i = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->OldLinkDirItems);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&i), bVar2) {
        fullPath = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
        cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,fullPath);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = 1;
      break;
    case NEW:
      this_local._7_1_ = 1;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_3b8,(cmPolicies *)0x3,id);
      poVar5 = std::operator<<((ostream *)local_398,(string *)&local_3b8);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_3b8);
      PrintLinkPolicyDiagnosis(this,(ostream *)local_398);
      pcVar1 = this->CMakeInstance;
      std::__cxx11::ostringstream::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&__range1);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_3d8,(cmListFileBacktrace *)&__range1);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range1);
      std::__cxx11::string::~string((string *)&local_3d8);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeLinkInformation::FinishLinkerSearchDirectories()
{
  // Support broken projects if necessary.
  if (this->OldLinkDirItems.empty() || this->OldUserFlagItems.empty() ||
      !this->OldLinkDirMode) {
    return true;
  }

  // Enforce policy constraints.
  switch (this->Target->GetPolicyStatusCMP0003()) {
    case cmPolicies::WARN:
      if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
            "CMP0003-WARNING-GIVEN")) {
        this->CMakeInstance->GetState()->SetGlobalProperty(
          "CMP0003-WARNING-GIVEN", "1");
        std::ostringstream w;
        this->PrintLinkPolicyDiagnosis(w);
        this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                          this->Target->GetBacktrace());
      }
    case cmPolicies::OLD:
      // OLD behavior is to add the paths containing libraries with
      // known full paths as link directories.
      break;
    case cmPolicies::NEW:
      // Should never happen due to assignment of OldLinkDirMode
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0003) << "\n";
      this->PrintLinkPolicyDiagnosis(e);
      this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                        this->Target->GetBacktrace());
      return false;
    }
  }

  // Add the link directories for full path items.
  for (std::string const& i : this->OldLinkDirItems) {
    this->OrderLinkerSearchPath->AddLinkLibrary(i);
  }
  return true;
}